

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

int __thiscall
CLabelTable::Insert(CLabelTable *this,char *nname,aint nvalue,uint traits,short equPageNum)

{
  bool bVar1;
  short sVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  EType local_120;
  bool local_f1;
  EType local_c8;
  EType local_c4;
  allocator<char> local_b1;
  key_type local_b0;
  mapped_type *local_90;
  mapped_type *label;
  SLabelTableEntry *pSStack_80;
  bool needsUpdate;
  SLabelTableEntry *label_1;
  allocator<char> local_59;
  key_type local_58;
  _Self local_38;
  iterator labelIt;
  EType deltaType;
  bool IsUndefined;
  short equPageNum_local;
  uint traits_local;
  aint nvalue_local;
  char *nname_local;
  CLabelTable *this_local;
  
  labelIt._M_node._5_1_ = (traits & 1) != 0;
  if ((traits & 0x20) == 0) {
    if ((traits & 6) == 0) {
      local_c8 = (EType)(Relocation::type != 0 && PseudoORG != DISP_INSIDE_RELOCATE);
    }
    else {
      local_c8 = Relocation::deltaType;
    }
    local_c4 = local_c8;
  }
  else {
    local_c4 = (EType)((traits & 0x40) != 0);
  }
  labelIt._M_node._0_4_ = local_c4;
  labelIt._M_node._6_2_ = equPageNum;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,nname,&local_59);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
       ::find(&this->symbols,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  label_1 = (SLabelTableEntry *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
            ::end(&this->symbols);
  bVar1 = std::operator!=((_Self *)&label_1,&local_38);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>
             ::operator->(&local_38);
    pSStack_80 = &ppVar3->second;
    if (((ppVar3->second).traits & 0x100) != 0) {
      WarningById(W_OPKEYWORD,nname,W_EARLY);
    }
    local_f1 = true;
    if (((pSStack_80->traits & 2) == 0) && (local_f1 = true, pSStack_80->page != -1)) {
      local_f1 = pSStack_80->updatePass < pass;
    }
    label._7_1_ = local_f1;
    if (local_f1 != false) {
      pSStack_80->value = nvalue;
      if (((traits & 4) == 0) || (labelIt._M_node._6_2_ == -1)) {
        sVar2 = getAddressPageNumber(nvalue,(traits & 6) != 0);
        pSStack_80->page = sVar2;
      }
      else {
        pSStack_80->page = labelIt._M_node._6_2_;
      }
      pSStack_80->traits = traits;
      pSStack_80->isRelocatable = (EType)labelIt._M_node;
      pSStack_80->updatePass = pass;
    }
    this_local._4_4_ = (uint)(label._7_1_ & 1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,nname,&local_b1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::operator[](&this->symbols,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pmVar4->traits = traits;
    pmVar4->updatePass = pass;
    pmVar4->value = nvalue;
    pmVar4->used = (bool)(labelIt._M_node._5_1_ & 1);
    local_90 = pmVar4;
    if (((traits & 4) == 0) || (labelIt._M_node._6_2_ == -1)) {
      if ((labelIt._M_node._5_1_ & 1) == 0) {
        sVar2 = getAddressPageNumber(nvalue,(traits & 6) != 0);
      }
      else {
        sVar2 = -1;
      }
      local_90->page = sVar2;
    }
    else {
      pmVar4->page = labelIt._M_node._6_2_;
    }
    if ((labelIt._M_node._5_1_ & 1) == 0) {
      local_120 = (EType)labelIt._M_node;
    }
    else {
      local_120 = OFF;
    }
    local_90->isRelocatable = local_120;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int CLabelTable::Insert(const char* nname, aint nvalue, unsigned traits, short equPageNum) {
	const bool IsUndefined = !!(traits & LABEL_IS_UNDEFINED);

	// the EQU/DEFL is relocatable when the expression itself is relocatable
	// the regular label is relocatable when relocation is active
	const Relocation::EType deltaType = \
			(traits&LABEL_HAS_RELOC_TRAIT) ? \
				(traits & LABEL_IS_RELOC ? Relocation::REGULAR : Relocation::OFF) : \
				(traits & (LABEL_IS_DEFL|LABEL_IS_EQU)) ? \
					Relocation::deltaType : \
					Relocation::type && DISP_INSIDE_RELOCATE != PseudoORG ? \
						Relocation::REGULAR : Relocation::OFF;
	// Find label in label table
	symbol_map_t::iterator labelIt = symbols.find(nname);
	if (symbols.end() != labelIt) {
		//if label already added (as used, or in previous pass), just refresh values
		auto& label = labelIt->second;
		if (label.traits&LABEL_IS_KEYWORD) WarningById(W_OPKEYWORD, nname, W_EARLY);
		bool needsUpdate = label.traits&LABEL_IS_DEFL || label.page == LABEL_PAGE_UNDEFINED || label.updatePass < pass;
		if (needsUpdate) {
			label.value = nvalue;
			if ((traits & LABEL_IS_EQU) && LABEL_PAGE_UNDEFINED != equPageNum) {
				label.page = equPageNum;
			} else {
				label.page = getAddressPageNumber(nvalue, traits & (LABEL_IS_DEFL|LABEL_IS_EQU));
			}
			label.traits = traits;
			label.isRelocatable = deltaType;
			label.updatePass = pass;
		}
		return needsUpdate;
	}
	auto& label = symbols[nname];
	label.traits = traits;
	label.updatePass = pass;
	label.value = nvalue;
	label.used = IsUndefined;
	if ((traits & LABEL_IS_EQU) && LABEL_PAGE_UNDEFINED != equPageNum) {
		label.page = equPageNum;
	} else {
		label.page = IsUndefined ? LABEL_PAGE_UNDEFINED : getAddressPageNumber(nvalue, traits & (LABEL_IS_DEFL|LABEL_IS_EQU));
	}
	label.isRelocatable = IsUndefined ? Relocation::OFF : deltaType;	// ignore "relocatable" for "undefined"
	return 1;
}